

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

string * __thiscall
pbrt::SimpleVolPathIntegrator::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SimpleVolPathIntegrator *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<int_const&>
            (__return_storage_ptr__,"[ SimpleVolPathIntegrator maxDepth: %d ] ",&this->maxDepth);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleVolPathIntegrator::ToString() const {
    return StringPrintf("[ SimpleVolPathIntegrator maxDepth: %d ] ", maxDepth);
}